

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall
ExprTest_EqualLogicalConstant_Test::TestBody(ExprTest_EqualLogicalConstant_Test *this)

{
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> other;
  LogicalConstant other_00;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> other_01;
  LogicalConstant other_02;
  Expr e2;
  Expr e2_00;
  undefined1 uVar1;
  undefined1 uVar2;
  ExprBase actual_predicate_value;
  long in_RDI;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined1 in_stack_fffffffffffffeef;
  undefined4 in_stack_fffffffffffffef0;
  type_conflict in_stack_fffffffffffffef4;
  type_conflict tVar3;
  BasicExprFactory<std::allocator<char>_> *in_stack_fffffffffffffef8;
  AssertionResult *pAVar4;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  int line;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar5;
  Type type;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  ExprBase in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  AssertionResult *in_stack_ffffffffffffff68;
  AssertionResult *assertion_result;
  AssertHelper *in_stack_ffffffffffffff70;
  AssertionResult local_88;
  string local_78 [64];
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48> local_38;
  undefined8 local_28;
  AssertionResult local_18;
  
  local_28 = *(undefined8 *)(in_RDI + 0x48);
  uVar5 = 0;
  other.super_ExprBase.impl_._7_1_ = in_stack_ffffffffffffff07;
  other.super_ExprBase.impl_._0_7_ = in_stack_ffffffffffffff00;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_fffffffffffffef8,other,
             in_stack_fffffffffffffef4);
  local_38.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                 (in_stack_fffffffffffffef8,SUB41((uint)in_stack_fffffffffffffef4 >> 0x18,0));
  other_00.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._7_1_ =
       in_stack_ffffffffffffff07;
  other_00.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_7_ =
       in_stack_ffffffffffffff00;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_fffffffffffffef8,other_00,
             in_stack_fffffffffffffef4);
  e2.super_ExprBase.impl_._7_1_ = in_stack_ffffffffffffff27;
  e2.super_ExprBase.impl_._0_7_ = in_stack_ffffffffffffff20;
  mp::Equal((Expr)in_stack_ffffffffffffff28.impl_,e2);
  pAVar4 = &local_18;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (bool)in_stack_fffffffffffffeef);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  type = (Type)((ulong)pAVar4 >> 0x20);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff20));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff50);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff20),type,
               (char *)CONCAT44(uVar5,in_stack_ffffffffffffff10),(int)((ulong)in_RDI >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff70,(Message *)in_stack_ffffffffffffff68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    std::__cxx11::string::~string(local_78);
    testing::Message::~Message((Message *)0x13a0e1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a15c);
  assertion_result = *(AssertionResult **)(in_RDI + 0x48);
  tVar3 = 0;
  other_01.super_ExprBase.impl_._7_1_ = in_stack_ffffffffffffff07;
  other_01.super_ExprBase.impl_._0_7_ = in_stack_ffffffffffffff00;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_fffffffffffffef8,other_01,
             0);
  line = (int)((ulong)in_RDI >> 0x20);
  actual_predicate_value.impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                         (in_stack_fffffffffffffef8,SUB41((uint)tVar3 >> 0x18,0));
  other_02.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._7_1_ =
       in_stack_ffffffffffffff07;
  other_02.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_7_ =
       in_stack_ffffffffffffff00;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_fffffffffffffef8,other_02,
             tVar3);
  e2_00.super_ExprBase.impl_._7_1_ = uVar1;
  e2_00.super_ExprBase.impl_._0_7_ = in_stack_ffffffffffffff20;
  mp::Equal((Expr)in_stack_ffffffffffffff28.impl_,e2_00);
  pAVar4 = &local_88;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(tVar3,in_stack_fffffffffffffef0),
             (bool)in_stack_fffffffffffffeef);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff20));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,in_stack_ffffffffffffff60,(char *)actual_predicate_value.impl_,
               in_stack_ffffffffffffff50);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff20),type,
               (char *)CONCAT44(uVar5,in_stack_ffffffffffffff10),line,
               (char *)CONCAT17(uVar2,in_stack_ffffffffffffff00));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff70,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(tVar3,in_stack_fffffffffffffef0));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
    testing::Message::~Message((Message *)0x13a2b4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a323);
  return;
}

Assistant:

TEST_F(ExprTest, EqualLogicalConstant) {
  EXPECT_TRUE(Equal(l0, factory_.MakeLogicalConstant(false)));
  EXPECT_FALSE(Equal(l0, factory_.MakeLogicalConstant(true)));
}